

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::color4f>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,color4f *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  pointer pSVar5;
  value_type *pvVar6;
  pointer pSVar7;
  optional<tinyusdz::value::color4f> pv;
  optional<tinyusdz::value::color4f> local_48;
  optional<tinyusdz::value::color4f> local_34;
  
  if (v == (color4f *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_default_value<tinyusdz::value::color4f>(&local_48,this);
    local_34.has_value_ = local_48.has_value_;
    if (local_48.has_value_ == true) goto LAB_003ab736;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar5 == pSVar7) {
      return false;
    }
  }
  else {
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar7 != pSVar5) {
    bVar4 = tinyusdz::value::TimeSamples::get<tinyusdz::value::color4f,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar4;
  }
  bVar4 = has_value(this);
  if (bVar4) {
    get_default_value<tinyusdz::value::color4f>(&local_48,this);
    local_34.has_value_ = local_48.has_value_;
    if (local_48.has_value_ != false) {
LAB_003ab736:
      local_34.contained._0_8_ = local_48.contained._0_8_;
      local_34.contained._8_8_ = local_48.contained._8_8_;
      pvVar6 = nonstd::optional_lite::optional<tinyusdz::value::color4f>::value(&local_34);
      fVar1 = pvVar6->g;
      fVar2 = pvVar6->b;
      fVar3 = pvVar6->a;
      v->r = pvVar6->r;
      v->g = fVar1;
      v->b = fVar2;
      v->a = fVar3;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }